

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O0

BlockStatementPtr __thiscall VMState::PushBlock(VMState *this)

{
  BlockStatement *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  BlockStatementPtr BVar1;
  shared_ptr<BlockStatement> local_30;
  undefined1 local_19;
  VMState *this_local;
  BlockStatementPtr *prevBlock;
  
  local_19 = 0;
  this_local = this;
  std::shared_ptr<BlockStatement>::shared_ptr
            ((shared_ptr<BlockStatement> *)this,(shared_ptr<BlockStatement> *)(in_RSI + 8));
  this_00 = (BlockStatement *)operator_new(0x30);
  BlockStatement::BlockStatement(this_00);
  std::shared_ptr<BlockStatement>::shared_ptr<BlockStatement,void>(&local_30,this_00);
  std::shared_ptr<BlockStatement>::operator=((shared_ptr<BlockStatement> *)(in_RSI + 8),&local_30);
  std::shared_ptr<BlockStatement>::~shared_ptr(&local_30);
  BVar1.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  BVar1.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (BlockStatementPtr)BVar1.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BlockStatementPtr PushBlock( void )
	{
		BlockStatementPtr prevBlock = m_Block;
		m_Block = BlockStatementPtr(new BlockStatement);

		return prevBlock;
	}